

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall ncnn::NetPrivate::update_input_output_names(NetPrivate *this)

{
  pointer ppcVar1;
  pointer piVar2;
  ulong uVar3;
  pointer local_28;
  
  ppcVar1 = (this->input_blob_names).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->input_blob_names).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppcVar1) {
    (this->input_blob_names).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppcVar1;
  }
  ppcVar1 = (this->output_blob_names).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->output_blob_names).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppcVar1) {
    (this->output_blob_names).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppcVar1;
  }
  piVar2 = (this->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    uVar3 = 0;
    do {
      local_28 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar2[uVar3]].name._M_dataplus._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&this->input_blob_names,
                 &local_28);
      uVar3 = uVar3 + 1;
      piVar2 = (this->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->input_blob_indexes).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  piVar2 = (this->output_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->output_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    uVar3 = 0;
    do {
      local_28 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar2[uVar3]].name._M_dataplus._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&this->output_blob_names,
                 &local_28);
      uVar3 = uVar3 + 1;
      piVar2 = (this->output_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->output_blob_indexes).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  return;
}

Assistant:

void NetPrivate::update_input_output_names()
{
    input_blob_names.clear();
    output_blob_names.clear();

    for (size_t i = 0; i < input_blob_indexes.size(); i++)
    {
        int blob_index = input_blob_indexes[i];
        input_blob_names.push_back(blobs[blob_index].name.c_str());
    }

    for (size_t i = 0; i < output_blob_indexes.size(); i++)
    {
        int blob_index = output_blob_indexes[i];
        output_blob_names.push_back(blobs[blob_index].name.c_str());
    }
}